

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::CoverageBinsArraySizeSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,CoverageBinsArraySizeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  CoverageBinsArraySizeSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->openBracket).kind;
    token._2_1_ = (this->openBracket).field_0x2;
    token.numFlags.raw = (this->openBracket).numFlags.raw;
    token.rawLen = (this->openBracket).rawLen;
    token.info = (this->openBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->expr->super_SyntaxNode);
  }
  else if (index == 2) {
    token_00.kind = (this->closeBracket).kind;
    token_00._2_1_ = (this->closeBracket).field_0x2;
    token_00.numFlags.raw = (this->closeBracket).numFlags.raw;
    token_00.rawLen = (this->closeBracket).rawLen;
    token_00.info = (this->closeBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax CoverageBinsArraySizeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBracket;
        case 1: return expr;
        case 2: return closeBracket;
        default: return nullptr;
    }
}